

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Method::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  int extraout_EDX;
  uint64_t in_RDX;
  undefined8 uVar2;
  byte in_R8B;
  ArrayPtr<const_char> AVar3;
  Maybe<capnp::schema::Value::Reader> local_40;
  
  uVar2 = (SegmentReader *)0xf264a779fef191ce;
  uVar1 = annotationValue<capnp::schema::Method::Reader>
                    (&local_40,(CapnpcCppMain *)0xf264a779fef191ce,proto,in_RDX);
  local_40.ptr.field_1._16_4_ = extraout_EDX;
  if (local_40.ptr.isSet == true) {
    in_R8B = local_40.ptr.field_1.value._reader.pointerCount == 0;
    uVar1 = local_40.ptr.field_1.value._reader.capTable;
    in_RCX = local_40.ptr.field_1.value._reader.pointers;
    uVar2 = local_40.ptr.field_1.value._reader.segment;
    local_40.ptr.field_1.value._reader.data._0_4_ = local_40.ptr.field_1.value._reader.nestingLimit;
  }
  if (local_40.ptr.isSet == false) {
    local_40.ptr._0_8_ = proto._reader.segment;
    local_40.ptr.field_1.value._reader.segment = (SegmentReader *)proto._reader.capTable;
    local_40.ptr.field_1.value._reader.capTable = (CapTableReader *)proto._reader.pointers;
    local_40.ptr.field_1._16_4_ = proto._reader.nestingLimit;
    if (proto._reader.pointerCount == 0) {
      local_40.ptr.field_1._16_4_ = 0x7fffffff;
      local_40.ptr.field_1.value._reader.capTable = (CapTableReader *)(WirePointer *)0x0;
      local_40.ptr._0_8_ = (SegmentReader *)0x0;
      local_40.ptr.field_1.value._reader.segment = (SegmentReader *)0x0;
    }
  }
  else {
    local_40.ptr._0_8_ = uVar2;
    local_40.ptr.field_1.value._reader.segment = (SegmentReader *)uVar1;
    local_40.ptr.field_1.value._reader.capTable = (CapTableReader *)in_RCX;
    if ((in_R8B & 1) != 0) {
      local_40.ptr.field_1._16_4_ = 0x7fffffff;
      local_40.ptr.field_1.value._reader.segment = (SegmentReader *)0x0;
      local_40.ptr.field_1.value._reader.capTable = (CapTableReader *)(WirePointer *)0x0;
      local_40.ptr._0_8_ = (SegmentReader *)0x0;
    }
  }
  AVar3 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_40,(void *)0x0,0);
  return (StringPtr)AVar3;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_SOME(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name.getText();
    } else {
      return proto.getName();
    }
  }